

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_func_queue_examples.cpp
# Opt level: O3

void density_tests::
     LfFunctionQueueSamples<(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
     ::func_queue_samples(ostream *i_ostream)

{
  func_queue_reentrant_misc_samples(i_ostream);
  func_queue_put_samples(i_ostream);
  func_queue_reentrant_put_samples(i_ostream);
  func_queue_try_put_samples(i_ostream);
  func_queue_try_reentrant_put_samples(i_ostream);
  func_queue_reentrant_consume_samples(i_ostream);
  return;
}

Assistant:

static void func_queue_samples(std::ostream & i_ostream)
        {
            func_queue_reentrant_misc_samples(i_ostream);

            func_queue_put_samples(i_ostream);
            func_queue_reentrant_put_samples(i_ostream);
            func_queue_try_put_samples(i_ostream);
            func_queue_try_reentrant_put_samples(i_ostream);

            func_queue_reentrant_consume_samples(i_ostream);
        }